

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  ushort *puVar1;
  reference ppDVar2;
  AlphaNum *in_R8;
  AlphaNum local_a0;
  AlphaNum local_70;
  undefined8 local_40;
  char *local_38;
  
  local_40 = 0x18;
  local_38 = "Expanded map entry type ";
  ppDVar2 = lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::iterator::operator*(*(iterator **)this);
  puVar1 = (ushort *)((*ppDVar2)->all_names_).payload_;
  local_70.piece_._M_len = (size_t)*puVar1;
  local_70.piece_._M_str = (char *)((long)puVar1 + ~local_70.piece_._M_len);
  local_a0.piece_._M_len = 0x26;
  local_a0.piece_._M_str = " conflicts with an existing enum type.";
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_40,&local_70,&local_a0,in_R8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}